

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O2

void CPU::WDC65816::ProcessorStorageConstructor::direct_indirect
               (AccessType type,bool is8bit,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementPC);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationConstructDirect);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchPreviousPCThrowaway);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementData);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchData);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationConstructDirectIndirect);
  read_write(type,is8bit,target);
  return;
}

Assistant:

static void direct_indirect(AccessType type, bool is8bit, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);					// DO.

		target(OperationConstructDirect);
		target(CycleFetchPreviousPCThrowaway);			// IO.

		target(CycleFetchIncrementData);				// AAL.
		target(CycleFetchData);							// AAH.

		target(OperationConstructDirectIndirect);

		read_write(type, is8bit, target);
	}